

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<QHeaderViewPrivate::SectionItem>::
emplace<QHeaderViewPrivate::SectionItem_const&>
          (QPodArrayOps<QHeaderViewPrivate::SectionItem> *this,qsizetype i,SectionItem *args)

{
  SectionItem **ppSVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  SectionItem SVar4;
  qsizetype qVar5;
  SectionItem *pSVar6;
  GrowthPosition where;
  
  pDVar3 = (this->super_QArrayDataPointer<QHeaderViewPrivate::SectionItem>).d;
  if ((pDVar3 != (Data *)0x0) &&
     ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if (((this->super_QArrayDataPointer<QHeaderViewPrivate::SectionItem>).size == i) &&
       (qVar5 = QArrayDataPointer<QHeaderViewPrivate::SectionItem>::freeSpaceAtEnd
                          (&this->super_QArrayDataPointer<QHeaderViewPrivate::SectionItem>),
       qVar5 != 0)) {
      (this->super_QArrayDataPointer<QHeaderViewPrivate::SectionItem>).ptr
      [(this->super_QArrayDataPointer<QHeaderViewPrivate::SectionItem>).size] = *args;
    }
    else {
      if ((i != 0) ||
         (qVar5 = QArrayDataPointer<QHeaderViewPrivate::SectionItem>::freeSpaceAtBegin
                            (&this->super_QArrayDataPointer<QHeaderViewPrivate::SectionItem>),
         qVar5 == 0)) goto LAB_00502457;
      (this->super_QArrayDataPointer<QHeaderViewPrivate::SectionItem>).ptr[-1] = *args;
      ppSVar1 = &(this->super_QArrayDataPointer<QHeaderViewPrivate::SectionItem>).ptr;
      *ppSVar1 = *ppSVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<QHeaderViewPrivate::SectionItem>).size;
    *pqVar2 = *pqVar2 + 1;
    return;
  }
LAB_00502457:
  SVar4 = *args;
  where = (GrowthPosition)
          (i == 0 && (this->super_QArrayDataPointer<QHeaderViewPrivate::SectionItem>).size != 0);
  QArrayDataPointer<QHeaderViewPrivate::SectionItem>::detachAndGrow
            (&this->super_QArrayDataPointer<QHeaderViewPrivate::SectionItem>,where,1,
             (SectionItem **)0x0,(QArrayDataPointer<QHeaderViewPrivate::SectionItem> *)0x0);
  pSVar6 = createHole(this,where,i,1);
  *pSVar6 = SVar4;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }